

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *this)

{
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoQuad>).super_TPZGeoEl =
       &PTR__TPZSavable_016b4ea0;
  TPZGeoElRefLess<pzgeom::TPZGeoQuad>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoQuad>,&PTR_PTR_016b2058);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoQuad>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_016b1d58;
  TPZVec<long>::TPZVec(&this->fSubEl,0);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&this->fRefPattern,(TPZRefPattern *)0x0);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}